

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# regexp_benchmark.cc
# Opt level: O2

void re2::Parse3OnePass(int iters,char *regexp,StringPiece *text)

{
  bool bVar1;
  Regexp *this;
  Prog *this_00;
  long lVar2;
  int iVar3;
  StringPiece sp [4];
  undefined1 local_1b0 [384];
  
  iVar3 = 0;
  if (iters < 1) {
    iters = 0;
  }
  for (; iVar3 != iters; iVar3 = iVar3 + 1) {
    StringPiece::StringPiece((StringPiece *)local_1b0,regexp);
    this = Regexp::Parse((StringPiece *)local_1b0,LikePerl,(RegexpStatus *)0x0);
    if (this == (Regexp *)0x0) {
      LogMessageFatal::LogMessageFatal
                ((LogMessageFatal *)local_1b0,
                 "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/regexp_benchmark.cc"
                 ,0x429);
      std::operator<<((ostream *)(local_1b0 + 8),"Check failed: re");
      LogMessageFatal::~LogMessageFatal((LogMessageFatal *)local_1b0);
    }
    this_00 = Regexp::CompileToProg(this,0);
    if (this_00 == (Prog *)0x0) {
      LogMessageFatal::LogMessageFatal
                ((LogMessageFatal *)local_1b0,
                 "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/regexp_benchmark.cc"
                 ,0x42b);
      std::operator<<((ostream *)(local_1b0 + 8),"Check failed: prog");
      LogMessageFatal::~LogMessageFatal((LogMessageFatal *)local_1b0);
    }
    bVar1 = Prog::IsOnePass(this_00);
    if (!bVar1) {
      LogMessageFatal::LogMessageFatal
                ((LogMessageFatal *)local_1b0,
                 "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/regexp_benchmark.cc"
                 ,0x42c);
      std::operator<<((ostream *)(local_1b0 + 8),"Check failed: prog->IsOnePass()");
      LogMessageFatal::~LogMessageFatal((LogMessageFatal *)local_1b0);
    }
    lVar2 = 0;
    do {
      *(undefined8 *)((long)&sp[0].ptr_ + lVar2) = 0;
      *(undefined4 *)((long)&sp[0].length_ + lVar2) = 0;
      lVar2 = lVar2 + 0x10;
    } while (lVar2 != 0x40);
    bVar1 = Prog::SearchOnePass(this_00,text,text,kAnchored,kFullMatch,sp,4);
    if (!bVar1) {
      LogMessageFatal::LogMessageFatal
                ((LogMessageFatal *)local_1b0,
                 "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/regexp_benchmark.cc"
                 ,0x42e);
      std::operator<<((ostream *)(local_1b0 + 8),
                      "Check failed: prog->SearchOnePass(text, text, Prog::kAnchored, Prog::kFullMatch, sp, 4)"
                     );
      LogMessageFatal::~LogMessageFatal((LogMessageFatal *)local_1b0);
    }
    Prog::~Prog(this_00);
    operator_delete(this_00);
    Regexp::Decref(this);
  }
  return;
}

Assistant:

void Parse3OnePass(int iters, const char* regexp, const StringPiece& text) {
  for (int i = 0; i < iters; i++) {
    Regexp* re = Regexp::Parse(regexp, Regexp::LikePerl, NULL);
    CHECK(re);
    Prog* prog = re->CompileToProg(0);
    CHECK(prog);
    CHECK(prog->IsOnePass());
    StringPiece sp[4];  // 4 because sp[0] is whole match.
    CHECK(prog->SearchOnePass(text, text, Prog::kAnchored, Prog::kFullMatch, sp, 4));
    delete prog;
    re->Decref();
  }
}